

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep_io.c
# Opt level: O1

int arkStep_SetMaxNonlinIters(ARKodeMem ark_mem,int maxcor)

{
  int iVar1;
  ARKodeARKStepMem step_mem;
  ARKodeARKStepMem local_20;
  
  iVar1 = arkStep_AccessStepMem(ark_mem,"arkStep_SetMaxNonlinIters",&local_20);
  if (iVar1 == 0) {
    if (local_20->NLS == (SUNNonlinearSolver)0x0) {
      arkProcessError(ark_mem,-0x20,0x414,"arkStep_SetMaxNonlinIters",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                      ,"No SUNNonlinearSolver object is present");
      iVar1 = -0x16;
    }
    else {
      iVar1 = 3;
      if (0 < maxcor) {
        iVar1 = maxcor;
      }
      local_20->maxcor = iVar1;
      iVar1 = SUNNonlinSolSetMaxIters();
      if (iVar1 == 0) {
        iVar1 = 0;
      }
      else {
        iVar1 = -0x20;
        arkProcessError(ark_mem,-0x20,0x421,"arkStep_SetMaxNonlinIters",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_arkstep_io.c"
                        ,"Error setting maxcor in SUNNonlinearSolver object");
      }
    }
  }
  return iVar1;
}

Assistant:

int arkStep_SetMaxNonlinIters(ARKodeMem ark_mem, int maxcor)
{
  ARKodeARKStepMem step_mem;
  int retval;

  /* access ARKodeARKStepMem structure */
  retval = arkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  SUNFunctionBegin(ark_mem->sunctx);

  /* Return error message if no NLS module is present */
  if (step_mem->NLS == NULL)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "No SUNNonlinearSolver object is present");
    return (ARK_ILL_INPUT);
  }

  /* argument <= 0 sets default, otherwise set input */
  if (maxcor <= 0) { step_mem->maxcor = MAXCOR; }
  else { step_mem->maxcor = maxcor; }

  /* send argument to NLS structure */
  retval = SUNNonlinSolSetMaxIters(step_mem->NLS, step_mem->maxcor);
  if (retval != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_NLS_OP_ERR, __LINE__, __func__, __FILE__,
                    "Error setting maxcor in SUNNonlinearSolver object");
    return (ARK_NLS_OP_ERR);
  }

  return (ARK_SUCCESS);
}